

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_pack.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,"Contents of the tuple:\t");
  poVar1 = std::operator<<(poVar1,"Dog");
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,"Cat");
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,"Hyena");
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,99);
  poVar1 = std::operator<<(poVar1,".");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return 0;
}

Assistant:

int main() {
	//A tuple with four elements
	std::tuple <const char *, const char *,
		const char *, int> _tuple = std::make_tuple ("Dog", "Cat", "Hyena", 99);

	//C++17
	auto [a,b,c,d] = _tuple;
	std::cout << std::endl;
	std::cout << "Contents of the tuple:\t" << a << ", " << b << ", " << c
				<< ", " << d << "." << std::endl;
	std::cout << std::endl;
}